

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFBO.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderIncompleteLayeredFBOTest::deinit(GeometryShaderIncompleteLayeredFBOTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_fbo_ids != (GLuint *)0x0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x440))(4);
    if (this->m_fbo_ids != (GLuint *)0x0) {
      operator_delete__(this->m_fbo_ids);
      this->m_fbo_ids = (GLuint *)0x0;
    }
  }
  if (this->m_to_ids != (GLuint *)0x0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(7);
    if (this->m_to_ids != (GLuint *)0x0) {
      operator_delete__(this->m_to_ids);
      this->m_to_ids = (GLuint *)0x0;
    }
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderIncompleteLayeredFBOTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release framebuffer objects */
	GeometryShaderLayeredFBOShared::deinitFBOs(gl, m_fbo_ids);

	if (m_fbo_ids != DE_NULL)
	{
		delete[] m_fbo_ids;

		m_fbo_ids = DE_NULL;
	}

	/* Release texture objects */
	GeometryShaderLayeredFBOShared::deinitTOs(gl, m_to_ids);

	if (m_to_ids != DE_NULL)
	{
		delete[] m_to_ids;

		m_to_ids = DE_NULL;
	}

	/* Release base class */
	TestCaseBase::deinit();
}